

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitvec.cpp
# Opt level: O0

void lshift8(void *blob,int nbytes,int c)

{
  byte bVar1;
  sbyte sVar2;
  uint8_t b_1;
  uint8_t a;
  int i_2;
  int i_1;
  int i;
  int b;
  uint8_t *k;
  int c_local;
  int nbytes_local;
  void *blob_local;
  
  if (c != 0) {
    i_1 = c >> 3;
    for (i = nbytes + -1; i_1 <= i; i = i + -1) {
      *(undefined1 *)((long)blob + (long)i) = *(undefined1 *)((long)blob + (long)(i - i_1));
    }
    while (i_1 = i_1 + -1, -1 < i_1) {
      *(undefined1 *)((long)blob + (long)i_1) = 0;
    }
    if ((c & 7U) != 0) {
      for (i_2 = nbytes + -1; -1 < i_2; i_2 = i_2 + -1) {
        if (i_2 == 0) {
          bVar1 = 0;
        }
        else {
          bVar1 = *(byte *)((long)blob + (long)(i_2 + -1));
        }
        sVar2 = (sbyte)(c & 7U);
        *(byte *)((long)blob + (long)i_2) =
             *(char *)((long)blob + (long)i_2) << sVar2 |
             (byte)((int)(uint)bVar1 >> (8U - sVar2 & 0x1f));
      }
    }
  }
  return;
}

Assistant:

void lshift8 ( void * blob, int nbytes, int c )
{
  uint8_t * k = (uint8_t*)blob;

  if(c == 0) return;

  int b = c >> 3;
  c &= 7;

  for(int i = nbytes-1; i >= b; i--)
  {
    k[i] = k[i-b];
  }

  for(int i = b-1; i >= 0; i--)
  {
    k[i] = 0;
  }

  if(c == 0) return;

  for(int i = nbytes-1; i >= 0; i--)
  {
    uint8_t a = k[i];
    uint8_t b = (i == 0) ? 0 : k[i-1];

    k[i] = (a << c) | (b >> (8-c));
  }
}